

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter.c
# Opt level: O1

void filter8(int8_t mask,uint8_t thresh,int8_t flat,uint8_t *op3,uint8_t *op2,uint8_t *op1,
            uint8_t *op0,uint8_t *oq0,uint8_t *oq1,uint8_t *oq2,uint8_t *oq3)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  char cVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  
  uVar18 = (uint)*oq0;
  if (mask == '\0' || flat == '\0') {
    cVar15 = *op1 + 0x80;
    cVar14 = *oq1 + 0x80;
    cVar8 = cVar15 - cVar14;
    if (SBORROW1(cVar15,cVar14)) {
      cVar8 = (-1 < (char)(cVar15 - cVar14)) + '\x7f';
    }
    uVar10 = (int)(char)*op0 ^ 0xffffff80;
    uVar19 = (uint)*op1 - (uint)*op0;
    uVar17 = -uVar19;
    if (0 < (int)uVar19) {
      uVar17 = uVar19;
    }
    cVar6 = *oq0 + 0x80;
    bVar5 = (uVar17 & 0xff) <= (uint)thresh;
    uVar18 = *oq1 - uVar18;
    uVar17 = -uVar18;
    if (0 < (int)uVar18) {
      uVar17 = uVar18;
    }
    iVar16 = (int)cVar8;
    if (bVar5 && uVar17 <= thresh) {
      iVar16 = 0;
    }
    iVar16 = ((int)cVar6 - uVar10) * 3 + iVar16;
    iVar11 = 0x7f;
    if (iVar16 < 0x7f) {
      iVar11 = iVar16;
    }
    bVar7 = 0x80;
    if (-0x80 < iVar11) {
      bVar7 = (byte)iVar11;
    }
    iVar11 = (int)(char)(bVar7 & mask);
    iVar16 = 0x7b;
    if (iVar11 < 0x7b) {
      iVar16 = iVar11;
    }
    cVar8 = '|';
    if (-0x84 < iVar16) {
      cVar8 = (char)iVar16;
    }
    cVar12 = (char)(cVar8 + '\x04') >> 3;
    cVar8 = (char)(cVar12 + '\x01') >> 1;
    if (!bVar5 || uVar17 > thresh) {
      cVar8 = '\0';
    }
    cVar13 = ((char)(cVar8 + cVar15) >> 7) + -0x80;
    if (!SCARRY1(cVar15,cVar8)) {
      cVar13 = cVar15 + cVar8;
    }
    cVar15 = cVar14 - cVar8;
    if (SBORROW1(cVar14,cVar8)) {
      cVar15 = (-1 < (char)(cVar14 - cVar8)) + '\x7f';
    }
    iVar16 = 0x7c;
    if (iVar11 < 0x7c) {
      iVar16 = iVar11;
    }
    cVar8 = (char)iVar16;
    if (iVar16 < -0x82) {
      cVar8 = '}';
    }
    cVar9 = (char)(cVar8 + '\x03') >> 3;
    cVar8 = (char)uVar10;
    cVar14 = ((char)(cVar8 + cVar9) >> 7) + -0x80;
    if (!SCARRY1(cVar9,cVar8)) {
      cVar14 = cVar9 + cVar8;
    }
    cVar8 = cVar6 - cVar12;
    if (SBORROW1(cVar6,cVar12)) {
      cVar8 = (-1 < (char)(cVar6 - cVar12)) + '\x7f';
    }
    *oq0 = cVar8 + 0x80;
    *op0 = cVar14 + 0x80;
    *oq1 = cVar15 + 0x80;
    *op1 = cVar13 + 0x80;
  }
  else {
    bVar7 = *op3;
    uVar17 = (uint)*op2;
    bVar1 = *op1;
    uVar10 = (uint)*op0;
    bVar2 = *oq1;
    bVar3 = *oq2;
    bVar4 = *oq3;
    *op2 = (uint8_t)((uint)bVar7 + (uint)bVar7 * 2 + (uint)*op0 + 4 + uVar17 * 2 + (uint)bVar1 +
                     uVar18 >> 3);
    iVar16 = uVar10 + uVar17 + 4;
    *op1 = (uint8_t)(iVar16 + ((uint)bVar1 + (uint)bVar7) * 2 + uVar18 + (uint)bVar2 >> 3);
    *op0 = (uint8_t)(bVar7 + uVar17 + (uint)bVar1 + uVar18 + uVar10 * 2 + (uint)bVar2 + (uint)bVar3
                     + 4 >> 3);
    *oq0 = (uint8_t)((uint)bVar2 + (uint)bVar3 + (uint)bVar4 + iVar16 + (uint)bVar1 + uVar18 * 2 >>
                    3);
    iVar16 = uVar10 + uVar18 + 4;
    *oq1 = (uint8_t)((uint)bVar1 + iVar16 + (uint)bVar2 * 2 + (uint)bVar3 + (uint)bVar4 * 2 >> 3);
    *oq2 = (uint8_t)(iVar16 + (uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 + (uint)bVar4 * 2 >> 3);
  }
  return;
}

Assistant:

static inline void filter8(int8_t mask, uint8_t thresh, int8_t flat,
                           uint8_t *op3, uint8_t *op2, uint8_t *op1,
                           uint8_t *op0, uint8_t *oq0, uint8_t *oq1,
                           uint8_t *oq2, uint8_t *oq3) {
  if (flat && mask) {
    const uint8_t p3 = *op3, p2 = *op2, p1 = *op1, p0 = *op0;
    const uint8_t q0 = *oq0, q1 = *oq1, q2 = *oq2, q3 = *oq3;

    // 7-tap filter [1, 1, 1, 2, 1, 1, 1]
    *op2 = ROUND_POWER_OF_TWO(p3 + p3 + p3 + 2 * p2 + p1 + p0 + q0, 3);
    *op1 = ROUND_POWER_OF_TWO(p3 + p3 + p2 + 2 * p1 + p0 + q0 + q1, 3);
    *op0 = ROUND_POWER_OF_TWO(p3 + p2 + p1 + 2 * p0 + q0 + q1 + q2, 3);
    *oq0 = ROUND_POWER_OF_TWO(p2 + p1 + p0 + 2 * q0 + q1 + q2 + q3, 3);
    *oq1 = ROUND_POWER_OF_TWO(p1 + p0 + q0 + 2 * q1 + q2 + q3 + q3, 3);
    *oq2 = ROUND_POWER_OF_TWO(p0 + q0 + q1 + 2 * q2 + q3 + q3 + q3, 3);
  } else {
    filter4(mask, thresh, op1, op0, oq0, oq1);
  }
}